

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::namespace_prefix(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__," ::",(allocator *)&local_50);
  if (ns->_M_string_length != 0) {
    while( true ) {
      lVar1 = std::__cxx11::string::find((char *)ns,0x2fd4e8);
      if (lVar1 == -1) break;
      std::__cxx11::string::substr((ulong)&local_50,(ulong)ns);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)ns);
      std::__cxx11::string::operator=((string *)ns,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (ns->_M_string_length != 0) {
      std::operator+(&local_50,ns,"::");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_prefix(string ns) {
  // Always start with "::", to avoid possible name collisions with
  // other names in one of the current namespaces.
  //
  // We also need a leading space, in case the name is used inside of a
  // template parameter.  "MyTemplate<::foo::Bar>" is not valid C++,
  // since "<:" is an alternative token for "[".
  string result = " ::";

  if (ns.size() == 0) {
    return result;
  }
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += ns.substr(0, loc);
    result += "::";
    ns = ns.substr(loc + 1);
  }
  if (ns.size() > 0) {
    result += ns + "::";
  }
  return result;
}